

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_authenticate(connectdata *conn,char *mech,char *initresp)

{
  CURLcode local_24;
  CURLcode result;
  char *initresp_local;
  char *mech_local;
  connectdata *conn_local;
  
  if (initresp == (char *)0x0) {
    local_24 = imap_sendf(conn,"AUTHENTICATE %s",mech);
  }
  else {
    local_24 = imap_sendf(conn,"AUTHENTICATE %s %s",mech,initresp);
  }
  return local_24;
}

Assistant:

static CURLcode imap_perform_authenticate(struct connectdata *conn,
                                          const char *mech,
                                          const char *initresp)
{
  CURLcode result = CURLE_OK;

  if(initresp) {
    /* Send the AUTHENTICATE command with the initial response */
    result = imap_sendf(conn, "AUTHENTICATE %s %s", mech, initresp);
  }
  else {
    /* Send the AUTHENTICATE command */
    result = imap_sendf(conn, "AUTHENTICATE %s", mech);
  }

  return result;
}